

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_teleport.cpp
# Opt level: O1

bool EV_TeleportGroup(int group_tid,AActor *victim,int source_tid,int dest_tid,bool moveSource,
                     bool fog)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  AActor *dest;
  PClass *pPVar4;
  undefined4 extraout_var;
  PClass *pPVar5;
  AActor **ppAVar6;
  AActor *source;
  AActor *victim_00;
  AActor *pAVar7;
  bool bVar8;
  NActorIterator iterator;
  FName local_6c;
  DAngle local_68;
  NActorIterator local_60;
  DVector3 local_48;
  
  if (source_tid == 0) {
    source = (AActor *)0x0;
  }
  else {
    for (source = AActor::TIDHash[source_tid & 0x7f];
        (source != (AActor *)0x0 && (source->tid != source_tid)); source = source->inext) {
    }
  }
  if (source == (AActor *)0x0) {
    bVar1 = EV_TeleportOther(group_tid,dest_tid,fog);
    return bVar1;
  }
  local_60.super_FActorIterator.base = (AActor *)0x0;
  local_6c.Index = 0x7c;
  local_60.super_FActorIterator.id = dest_tid;
  local_60.type = PClass::FindClass(&local_6c);
  dest = NActorIterator::Next(&local_60);
  if (dest == (AActor *)0x0) {
    bVar1 = false;
  }
  else {
    iVar3 = FName::NameManager::FindName(&FName::NameData,"TeleportDest2",true);
    local_60.super_FActorIterator.base =
         (AActor *)CONCAT44(local_60.super_FActorIterator.base._4_4_,iVar3);
    pPVar4 = PClass::FindClass((FName *)&local_60);
    if ((dest->super_DThinker).super_DObject.Class == (PClass *)0x0) {
      iVar3 = (**(dest->super_DThinker).super_DObject._vptr_DObject)();
      (dest->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar3);
    }
    pPVar5 = (dest->super_DThinker).super_DObject.Class;
    bVar8 = pPVar5 != (PClass *)0x0;
    if (pPVar5 != pPVar4 && bVar8) {
      do {
        pPVar5 = pPVar5->ParentClass;
        bVar8 = pPVar5 != (PClass *)0x0;
        if (pPVar5 == pPVar4) break;
      } while (pPVar5 != (PClass *)0x0);
    }
    if (group_tid == 0 && victim != (AActor *)0x0) {
      bVar1 = DoGroupForOne(victim,source,dest,(bool)(bVar8 ^ 1U),fog);
    }
    else {
      pAVar7 = (AActor *)0x0;
      bVar1 = false;
      while( true ) {
        if (group_tid == 0) {
          victim_00 = (AActor *)0x0;
        }
        else {
          ppAVar6 = &pAVar7->inext;
          if (pAVar7 == (AActor *)0x0) {
            ppAVar6 = (AActor **)((long)AActor::TIDHash + (ulong)((group_tid & 0x7fU) << 3));
          }
          for (victim_00 = *ppAVar6;
              (pAVar7 = victim_00, victim_00 != (AActor *)0x0 && (victim_00->tid != group_tid));
              victim_00 = victim_00->inext) {
          }
        }
        if (victim_00 == (AActor *)0x0) break;
        bVar2 = DoGroupForOne(victim_00,source,dest,(bool)(bVar8 ^ 1U),fog);
        bVar1 = (bool)(bVar1 | bVar2);
      }
    }
    if ((moveSource) && (bVar1 != false)) {
      if (bVar8 == false) {
        local_48.Z = -2147483648.0;
      }
      else {
        local_48.Z = (dest->__Pos).Z;
      }
      local_48.X = (dest->__Pos).X;
      local_48.Y = (dest->__Pos).Y;
      local_68.Degrees = 0.0;
      P_Teleport(source,&local_48,&local_68,4);
      (source->Angles).Yaw.Degrees = (dest->Angles).Yaw.Degrees;
      bVar1 = true;
    }
  }
  return bVar1;
}

Assistant:

bool EV_TeleportGroup (int group_tid, AActor *victim, int source_tid, int dest_tid, bool moveSource, bool fog)
{
	AActor *sourceOrigin, *destOrigin;
	{
		FActorIterator iterator (source_tid);
		sourceOrigin = iterator.Next ();
	}
	if (sourceOrigin == NULL)
	{ // If there is no source origin, behave like TeleportOther
		return EV_TeleportOther (group_tid, dest_tid, fog);
	}

	{
		NActorIterator iterator (NAME_TeleportDest, dest_tid);
		destOrigin = iterator.Next ();
	}
	if (destOrigin == NULL)
	{
		return false;
	}

	bool didSomething = false;
	bool floorz = !destOrigin->IsKindOf (PClass::FindClass("TeleportDest2"));

	// Use the passed victim if group_tid is 0
	if (group_tid == 0 && victim != NULL)
	{
		didSomething = DoGroupForOne (victim, sourceOrigin, destOrigin, floorz, fog);
	}
	else
	{
		FActorIterator iterator (group_tid);

		// For each actor with tid matching arg0, move it to the same
		// position relative to destOrigin as it is relative to sourceOrigin
		// before the teleport.
		while ( (victim = iterator.Next ()) )
		{
			didSomething |= DoGroupForOne (victim, sourceOrigin, destOrigin, floorz, fog);
		}
	}

	if (moveSource && didSomething)
	{
		didSomething |=
			P_Teleport (sourceOrigin, destOrigin->PosAtZ(floorz ? ONFLOORZ : destOrigin->Z()), 0., TELF_KEEPORIENTATION);
		sourceOrigin->Angles.Yaw = destOrigin->Angles.Yaw;
	}

	return didSomething;
}